

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000165510 = 0x2d2d2d2d2d2d2d;
    uRam0000000000165517._0_1_ = '-';
    uRam0000000000165517._1_1_ = '-';
    uRam0000000000165517._2_1_ = '-';
    uRam0000000000165517._3_1_ = '-';
    uRam0000000000165517._4_1_ = '-';
    uRam0000000000165517._5_1_ = '-';
    uRam0000000000165517._6_1_ = '-';
    uRam0000000000165517._7_1_ = '-';
    DAT_00165500 = '-';
    DAT_00165500_1._0_1_ = '-';
    DAT_00165500_1._1_1_ = '-';
    DAT_00165500_1._2_1_ = '-';
    DAT_00165500_1._3_1_ = '-';
    DAT_00165500_1._4_1_ = '-';
    DAT_00165500_1._5_1_ = '-';
    DAT_00165500_1._6_1_ = '-';
    uRam0000000000165508 = 0x2d2d2d2d2d2d2d;
    DAT_0016550f = 0x2d;
    DAT_001654f0 = '-';
    DAT_001654f0_1._0_1_ = '-';
    DAT_001654f0_1._1_1_ = '-';
    DAT_001654f0_1._2_1_ = '-';
    DAT_001654f0_1._3_1_ = '-';
    DAT_001654f0_1._4_1_ = '-';
    DAT_001654f0_1._5_1_ = '-';
    DAT_001654f0_1._6_1_ = '-';
    uRam00000000001654f8._0_1_ = '-';
    uRam00000000001654f8._1_1_ = '-';
    uRam00000000001654f8._2_1_ = '-';
    uRam00000000001654f8._3_1_ = '-';
    uRam00000000001654f8._4_1_ = '-';
    uRam00000000001654f8._5_1_ = '-';
    uRam00000000001654f8._6_1_ = '-';
    uRam00000000001654f8._7_1_ = '-';
    DAT_001654e0 = '-';
    DAT_001654e0_1._0_1_ = '-';
    DAT_001654e0_1._1_1_ = '-';
    DAT_001654e0_1._2_1_ = '-';
    DAT_001654e0_1._3_1_ = '-';
    DAT_001654e0_1._4_1_ = '-';
    DAT_001654e0_1._5_1_ = '-';
    DAT_001654e0_1._6_1_ = '-';
    uRam00000000001654e8._0_1_ = '-';
    uRam00000000001654e8._1_1_ = '-';
    uRam00000000001654e8._2_1_ = '-';
    uRam00000000001654e8._3_1_ = '-';
    uRam00000000001654e8._4_1_ = '-';
    uRam00000000001654e8._5_1_ = '-';
    uRam00000000001654e8._6_1_ = '-';
    uRam00000000001654e8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001654d8._0_1_ = '-';
    uRam00000000001654d8._1_1_ = '-';
    uRam00000000001654d8._2_1_ = '-';
    uRam00000000001654d8._3_1_ = '-';
    uRam00000000001654d8._4_1_ = '-';
    uRam00000000001654d8._5_1_ = '-';
    uRam00000000001654d8._6_1_ = '-';
    uRam00000000001654d8._7_1_ = '-';
    DAT_0016551f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }